

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

Dictionary * __thiscall
nvim::Nvim::get_commands(Dictionary *__return_storage_ptr__,Nvim *this,Dictionary *opts)

{
  _Rb_tree_header *p_Var1;
  string local_40;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"nvim_get_commands","");
  NvimRPC::
  call<std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_40,__return_storage_ptr__,opts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Dictionary Nvim::get_commands(const Dictionary& opts) {
    Dictionary res;
    client_.call("nvim_get_commands", res, opts);
    return res;
}